

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O3

bool __thiscall Dinic::levels(Dinic *this)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pvVar5;
  int *piVar6;
  pointer pEVar7;
  int *piVar8;
  undefined1 auStack_d8 [8];
  int b;
  _Elt_pointer local_c8;
  _Elt_pointer piStack_c0;
  _Elt_pointer local_b8;
  _Map_pointer ppiStack_b0;
  _Elt_pointer local_a8;
  _Elt_pointer piStack_a0;
  _Elt_pointer local_98;
  _Map_pointer ppiStack_90;
  undefined1 local_88 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> bfs;
  
  piVar3 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 != piVar4) {
    memset(piVar3,0xff,((long)piVar4 + (-4 - (long)piVar3) & 0xfffffffffffffffcU) + 4);
  }
  piVar3[this->S] = 0;
  bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._4_4_ = this->S;
  auStack_d8 = (undefined1  [8])0x0;
  _b = 0;
  local_c8 = (_Elt_pointer)0x0;
  piStack_c0 = (_Elt_pointer)0x0;
  local_b8 = (_Elt_pointer)0x0;
  ppiStack_b0 = (_Map_pointer)0x0;
  local_a8 = (_Elt_pointer)0x0;
  piStack_a0 = (_Elt_pointer)0x0;
  local_98 = (_Elt_pointer)0x0;
  ppiStack_90 = (_Map_pointer)0x0;
  std::deque<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((deque<int,std::allocator<int>> *)auStack_d8,
             (undefined1 *)
             ((long)&bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 4));
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_88,
             (_Deque_base<int,_std::allocator<int>_> *)auStack_d8);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_d8);
  if (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_node !=
      (_Map_pointer)
      bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size)
  {
    do {
      iVar1 = *(int *)bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_map_size;
      if ((_Elt_pointer)
          bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_map_size ==
          bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
          ._M_first + -1) {
        operator_delete(bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur);
        bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_map_size = *(size_t *)
                       (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_start._M_last + 2);
        bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
        _M_first = (_Elt_pointer)
                   (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_map_size + 0x200);
        bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
        _M_cur = (_Elt_pointer)
                 bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                 _M_map_size;
        bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
        _M_last = bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_last + 2;
      }
      else {
        bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_map_size = bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_map_size + 4;
      }
      if (iVar1 == this->T) break;
      pvVar5 = (this->g).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar6 = *(pointer *)
                ((long)&pvVar5[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (piVar8 = pvVar5[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar8 != piVar6; piVar8 = piVar8 + 1) {
        pEVar7 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar2 = pEVar7[*piVar8].b;
        auStack_d8._4_4_ = (undefined4)((ulong)auStack_d8 >> 0x20);
        auStack_d8._0_4_ = iVar2;
        piVar3 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((piVar3[iVar2] == -1) && (pEVar7 = pEVar7 + *piVar8, pEVar7->cap != pEVar7->flow)) {
          piVar3[iVar2] = piVar3[iVar1] + 1;
          if (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_start._M_node ==
              (_Map_pointer)
              (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_finish._M_first + -1)) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)local_88,(int *)auStack_d8);
          }
          else {
            *(int *)bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node = iVar2;
            bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_start._M_node =
                 (_Map_pointer)
                 ((long)bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node + 4);
          }
        }
      }
    } while (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_start._M_node !=
             (_Map_pointer)
             bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_map_size);
  }
  iVar1 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[this->T];
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_88);
  return iVar1 != -1;
}

Assistant:

bool levels() {
        fill(d.begin(), d.end(), -1);
        d[S] = 0;
        queue<int> bfs({S});
        while (!bfs.empty()) {
            int a = bfs.front();
            bfs.pop();
            if (a == T) break;
            for (auto x : g[a]) {
                int b = e[x].b;
                if (d[b] != -1 || e[x].unused() == 0) continue;
                d[b] = d[a] + 1;
                bfs.push(b);
            }
        }
        return d[T] != -1;
    }